

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

gravity_value_t convert_map2string(gravity_vm *vm,gravity_map_t *map)

{
  gravity_value_t *pgVar1;
  uint32_t n;
  char *s;
  gravity_list_t *data;
  gravity_class_t **ppgVar2;
  char *__src;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  gravity_class_t *pgVar6;
  size_t __n;
  uint uVar7;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar8;
  char *__src_00;
  uint uVar9;
  ulong uVar10;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar11;
  long lVar12;
  gravity_class_t *pgVar13;
  size_t __n_00;
  gravity_value_t key;
  gravity_value_t v;
  gravity_value_t v_00;
  gravity_value_t gVar14;
  gravity_value_t gVar15;
  uint local_7c;
  
  uVar10 = 1;
  s = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
  *s = '[';
  n = gravity_hash_count(map->hash);
  data = gravity_list_new(vm,n);
  gravity_hash_iterate(map->hash,map_keys_array,data);
  uVar3 = (ulong)(uint)(data->array).n;
  if (uVar3 == 0) {
    uVar5 = 1;
  }
  else {
    uVar5 = 1;
    local_7c = 0x200;
    lVar12 = 0;
    do {
      pgVar1 = (data->array).p;
      pgVar6 = *(gravity_class_t **)((long)&pgVar1->isa + lVar12);
      aVar8 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)&pgVar1->field_1 + lVar12))->
              n;
      gVar14.field_1.n = aVar8.n;
      gVar14.isa = pgVar6;
      key.field_1.n = aVar8.n;
      key.isa = pgVar6;
      ppgVar2 = &gravity_hash_lookup(map->hash,key)->isa;
      if ((gravity_value_t *)ppgVar2 == (gravity_value_t *)0x0) {
        ppgVar2 = &gravity_class_null;
        aVar11.n = 0;
      }
      else {
        aVar11 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
                 (((gravity_value_t *)ppgVar2)->field_1).n;
      }
      pgVar13 = ((gravity_value_t *)ppgVar2)->isa;
      if (pgVar6 != gravity_class_string) {
        v.field_1.n = aVar8.n;
        v.isa = pgVar6;
        gVar14 = convert_value2string(vm,v);
        pgVar6 = gravity_class_string;
      }
      aVar8 = gVar14.field_1;
      if (gVar14.isa != pgVar6) {
        aVar8.n = 0;
      }
      if ((gravity_map_t *)aVar11.n == map && gravity_class_map == pgVar13) {
        aVar11.n = 0;
        pgVar13 = gravity_class_null;
      }
      gVar15.field_1.n = aVar11.n;
      gVar15.isa = pgVar6;
      if (pgVar13 != pgVar6) {
        v_00.field_1.n = aVar11.n;
        v_00.isa = pgVar13;
        gVar15 = convert_value2string(vm,v_00);
        pgVar6 = gravity_class_string;
      }
      aVar11 = gVar15.field_1;
      if (gVar15.isa != pgVar6) {
        aVar11.n = 0;
      }
      __n_00 = 3;
      __src_00 = "N/A";
      __n = 3;
      if (aVar8.n != 0) {
        __src_00 = (char *)(aVar8.p)->objclass;
        __n = (size_t)*(uint *)((long)&(aVar8.p)->identifier + 4);
      }
      __src = "N/A";
      if (aVar11.n != 0) {
        __src = (char *)(aVar11.p)->objclass;
        __n_00 = (size_t)*(uint *)((long)&(aVar11.p)->identifier + 4);
      }
      uVar7 = (int)uVar5 + (int)__n;
      uVar9 = (int)__n_00 + uVar7 + 4;
      if (local_7c < uVar9) {
        local_7c = uVar9 + local_7c;
        s = (char *)gravity_realloc((gravity_vm *)0x0,s,(ulong)local_7c);
      }
      memcpy(s + uVar5,__src_00,__n);
      s[uVar7] = ':';
      memcpy(s + ((int)__n + (int)uVar5 + 1),__src,__n_00);
      iVar4 = (int)__n_00 + uVar7;
      uVar5 = (ulong)(iVar4 + 1);
      if (uVar10 < uVar3) {
        s[uVar5] = ',';
        uVar5 = (ulong)(iVar4 + 2);
      }
      lVar12 = lVar12 + 0x10;
      uVar10 = uVar10 + 1;
    } while (uVar3 << 4 != lVar12);
  }
  s[uVar5] = ']';
  uVar7 = (int)uVar5 + 1;
  s[uVar7] = '\0';
  gVar14 = gravity_string_to_value(vm,s,uVar7);
  free(s);
  return gVar14;
}

Assistant:

static inline gravity_value_t convert_map2string (gravity_vm *vm, gravity_map_t *map) {
    // allocate initial memory to a 512 buffer
    uint32_t len = 512;
    char *buffer = mem_alloc(NULL, len+1);
    buffer[0] = '[';
    uint32_t pos = 1;

    // get keys list
    uint32_t count = gravity_hash_count(map->hash);
    gravity_list_t *list = gravity_list_new(vm, count);
    gravity_hash_iterate(map->hash, map_keys_array, (void *)list);

    count = (uint32_t) marray_size(list->array);
    for (uint32_t i=0; i<count; ++i) {
        gravity_value_t key = marray_get(list->array, i);
        gravity_value_t *valueptr = gravity_hash_lookup(map->hash, key);
        gravity_value_t value = (valueptr) ? *valueptr : VALUE_FROM_NULL;
        
        // key conversion
        if (!VALUE_ISA_STRING(key)) {
            key = convert_value2string(vm, key);
        }
        gravity_string_t *key_string = (VALUE_ISA_STRING(key)) ? VALUE_AS_STRING(key) : NULL;
        
        // value conversion
        if (VALUE_ISA_MAP(value) && (VALUE_AS_MAP(value) == map)) {
            // to avoid infinite loop
            value = VALUE_FROM_NULL;
        }
        if (!VALUE_ISA_STRING(value)) {
            value = convert_value2string(vm, value);
        }
        gravity_string_t *value_string = (VALUE_ISA_STRING(value)) ? VALUE_AS_STRING(value) : NULL;
        
        // KEY
        char *s1 = (key_string) ? key_string->s : "N/A";
        uint32_t len1 = (key_string) ? key_string->len : 3;

        // VALUE
        char *s2 = (value_string) ? value_string->s : "N/A";
        uint32_t len2 = (value_string) ? value_string->len : 3;

        // check if buffer needs to be reallocated
        if (len1 + len2 + pos + 4 > len) {
            len = (len1 + len2 + pos + 4) + len;
            buffer = mem_realloc(NULL, buffer, len);
        }

        // copy key string to new buffer
        memcpy(buffer+pos, s1, len1);
        pos += len1;

        // copy ':' key/value separator
        memcpy(buffer+pos, ":", 1);
        pos += 1;

        // copy value string to new buffer
        memcpy(buffer+pos, s2, len2);
        pos += len2;

        // add entries separator
        if (i+1 < count) {
            memcpy(buffer+pos, ",", 1);
            pos += 1;
        }
    }

    // Write latest ] character
    memcpy(buffer+pos, "]", 1);
    buffer[++pos] = 0;

    gravity_value_t result = VALUE_FROM_STRING(vm, buffer, pos);
    mem_free(buffer);
    return result;
}